

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Syn4(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  bool bVar3;
  uint local_3c;
  uint local_38;
  int fVeryVerbose;
  int fVerbose;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vwh");
    if (iVar1 == -1) {
      bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
      if (bVar3) {
        pNew = Gia_ManAigSyn4(pAbc->pGia,local_38,local_3c);
        Abc_FrameUpdateGia(pAbc,pNew);
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Syn4(): There is no AIG.\n");
      }
      pAbc_local._4_4_ = (uint)!bVar3;
      return pAbc_local._4_4_;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 == 0x76) {
      local_38 = local_38 ^ 1;
    }
    else {
      if (iVar1 != 0x77) break;
      local_3c = local_3c ^ 1;
    }
  }
  Abc_Print(-2,"usage: &syn4 [-lvh]\n");
  Abc_Print(-2,"\t         performs AIG optimization\n");
  pcVar2 = "no";
  if (local_38 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_3c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Syn4( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Syn4(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManAigSyn4( pAbc->pGia, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &syn4 [-lvh]\n" );
    Abc_Print( -2, "\t         performs AIG optimization\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}